

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O0

V2f __thiscall anon_unknown.dwarf_5da2::WorldState::CursorUV(WorldState *this,double x,double y)

{
  const_reference pvVar1;
  float *pfVar2;
  float fVar3;
  V2f VVar4;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float yy;
  float xx;
  double y_local;
  double x_local;
  WorldState *this_local;
  
  local_30 = (float)y;
  local_2c = (float)x;
  _yy = y;
  y_local = x;
  x_local = (double)this;
  pvVar1 = std::array<int,_2UL>::operator[](&this->win_sz,0);
  local_34 = (float)x / (float)*pvVar1 - 0.5;
  local_34 = local_34 + local_34;
  local_38 = -1.0;
  local_3c = 1.0;
  pfVar2 = std::clamp<float>(&local_34,&local_38,&local_3c);
  this_local._0_4_ = *pfVar2;
  pvVar1 = std::array<int,_2UL>::operator[](&this->win_sz,1);
  fVar3 = (float)*pvVar1 - local_30;
  pvVar1 = std::array<int,_2UL>::operator[](&this->win_sz,1);
  local_40 = fVar3 / (float)*pvVar1 - 0.5;
  local_40 = local_40 + local_40;
  local_44 = -1.0;
  local_48 = 1.0;
  pfVar2 = std::clamp<float>(&local_40,&local_44,&local_48);
  VVar4._M_elems[0] = this_local._0_4_;
  VVar4._M_elems[1] = *pfVar2;
  return (V2f)VVar4._M_elems;
}

Assistant:

auto CursorUV(double x, double y) const -> V2f { // shitty glfw interface
    auto xx = static_cast<float>(x);
    auto yy = static_cast<float>(y);
    return {std::clamp(2 * (xx / win_sz[0] - .5f), -1.f, 1.f),
            std::clamp(2 * ((win_sz[1] - yy) / win_sz[1] - .5f), -1.f, 1.f)};
  }